

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O3

size_t tinyusdz::LZ4Compression::DecompressFromBuffer
                 (char *compressedPtr,char *outputPtr,size_t compressedSize,size_t maxOutputSize,
                 string *err)

{
  char cVar1;
  int compressedSize_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  char *pcVar8;
  long *plVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  int *source;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ulong local_60;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (compressedSize < 2) {
    if (err == (string *)0x0) {
      return 0;
    }
    pcVar10 = (char *)err->_M_string_length;
    pcVar8 = "Invalid compressedSize.\n";
  }
  else {
    cVar1 = *compressedPtr;
    if (cVar1 == '\0' || 0x7dffffff < maxOutputSize) {
      source = (int *)(compressedPtr + 1);
      if (cVar1 != '\0') {
        if (cVar1 < '\x01') {
          return 0;
        }
        iVar11 = (int)cVar1;
        uVar15 = 1;
        sVar13 = 0;
        local_60 = compressedSize;
        do {
          uVar15 = uVar15 + 4;
          if (local_60 < uVar15) {
joined_r0x00344095:
            if (err == (string *)0x0) {
              return 0;
            }
            ::std::__cxx11::string::append((char *)err);
            return 0;
          }
          compressedSize_00 = *source;
          local_58 = sVar13;
          if ((0x7e000000 < (long)compressedSize_00) || (compressedSize_00 < 1))
          goto joined_r0x00344095;
          uVar4 = 0x7e000000;
          if (maxOutputSize < 0x7e000000) {
            uVar4 = maxOutputSize;
          }
          uVar3 = LZ4_decompress_safe((char *)(source + 1),outputPtr,compressedSize_00,(int)uVar4);
          if ((int)uVar3 < 1) {
            if (err == (string *)0x0) {
              return 0;
            }
            uVar12 = -uVar3;
            uVar14 = 1;
            if (uVar12 < 10) goto LAB_0034426e;
            uVar7 = uVar12;
            uVar2 = 4;
            goto LAB_00344103;
          }
          uVar4 = (ulong)uVar3;
          bVar16 = maxOutputSize < uVar4;
          maxOutputSize = maxOutputSize - uVar4;
          if (bVar16) {
            if (err == (string *)0x0) {
              return 0;
            }
            pcVar10 = (char *)err->_M_string_length;
            pcVar8 = "Failed to decompress data, possibly corrupt?\n";
            goto LAB_00343f52;
          }
          iVar11 = iVar11 + -1;
          source = (int *)((long)(source + 1) + (long)compressedSize_00);
          outputPtr = outputPtr + uVar4;
          sVar13 = local_58 + uVar4;
          if (iVar11 == 0) {
            return sVar13;
          }
        } while( true );
      }
      uVar3 = LZ4_decompress_safe((char *)source,outputPtr,(int)compressedSize + -1,
                                  (int)maxOutputSize);
      if (-1 < (int)uVar3) {
        return (ulong)uVar3;
      }
      if (err == (string *)0x0) {
        return 0;
      }
      uVar3 = -uVar3;
      uVar12 = 1;
      if (9 < uVar3) {
        uVar14 = uVar3;
        uVar7 = 4;
        do {
          uVar12 = uVar7;
          if (uVar14 < 100) {
            uVar12 = uVar12 - 2;
            goto LAB_00344174;
          }
          if (uVar14 < 1000) {
            uVar12 = uVar12 - 1;
            goto LAB_00344174;
          }
          if (uVar14 < 10000) goto LAB_00344174;
          bVar16 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          uVar7 = uVar12 + 4;
        } while (bVar16);
        uVar12 = uVar12 + 1;
      }
LAB_00344174:
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 + '\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_50[0] + 1),uVar12,uVar3);
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3ec820);
      local_a0 = &local_90;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_90 = *plVar9;
        lStack_88 = plVar5[3];
      }
      else {
        local_90 = *plVar9;
        local_a0 = (long *)*plVar5;
      }
      local_98 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_a0);
      local_80 = &local_70;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_70 = *plVar9;
        lStack_68 = plVar5[3];
      }
      else {
        local_70 = *plVar9;
        local_80 = (long *)*plVar5;
      }
      local_78 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      goto LAB_00344361;
    }
    if (err == (string *)0x0) {
      return 0;
    }
    pcVar10 = (char *)err->_M_string_length;
    pcVar8 = "Corrupted LZ4 compressed data.\n";
  }
LAB_00343f52:
  ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar10,(ulong)pcVar8);
  return 0;
  while( true ) {
    if (uVar7 < 10000) goto LAB_0034426e;
    bVar16 = uVar7 < 100000;
    uVar7 = uVar7 / 10000;
    uVar2 = uVar14 + 4;
    if (bVar16) break;
LAB_00344103:
    uVar14 = uVar2;
    if (uVar7 < 100) {
      uVar14 = uVar14 - 2;
      goto LAB_0034426e;
    }
    if (uVar7 < 1000) {
      uVar14 = uVar14 - 1;
      goto LAB_0034426e;
    }
  }
  uVar14 = uVar14 + 1;
LAB_0034426e:
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar14 - (char)((int)uVar3 >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_50[0]),uVar14,uVar12);
  puVar6 = (undefined8 *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3ec820);
  local_a0 = &local_90;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_90 = *plVar5;
    lStack_88 = puVar6[3];
  }
  else {
    local_90 = *plVar5;
    local_a0 = (long *)*puVar6;
  }
  local_98 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)::std::__cxx11::string::append((char *)&local_a0);
  local_80 = &local_70;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = puVar6[3];
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*puVar6;
  }
  local_78 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
LAB_00344361:
  ::std::__cxx11::string::operator=((string *)err,(string *)&local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return 0;
}

Assistant:

size_t LZ4Compression::DecompressFromBuffer(char const *compressedPtr,
                                               char *outputPtr,
                                               size_t compressedSize,
                                               size_t maxOutputSize,
                                               std::string *err) {
  if (compressedSize <= 1) {
      if (err) {
        (*err) =
            "Invalid compressedSize.\n";
      }
    return 0;
  }

  // Check first byte for # chunks.
  int nChunks = *compressedPtr++;
  if (nChunks > 127) {
    if (err) {
      (*err) =
          "Too many chunks in LZ4 compressed data.\n";
    }
    return 0;
  }

  DCOUT("compressedSize = " << compressedSize);
  DCOUT("maxOutputSize = " << maxOutputSize);
  DCOUT("nChunks = " << nChunks);
  //std::cout << "compressedSize = " << compressedSize << "\n";
  //std::cout << "maxOutputSize = " << maxOutputSize << "\n";
  //std::cout << "nChunks = " << nChunks << "\n";

  size_t consumedCompressedSize = 1;

  if (maxOutputSize < LZ4_MAX_INPUT_SIZE) {
    // nChunks must be 0 for < LZ4_MAX_INPUT_SIZE
    if (nChunks != 0) {
      if (err) {
        (*err) = "Corrupted LZ4 compressed data.\n";
      }
      return 0;
    }
  }

  if (nChunks == 0) {
    // Just one.
    int nDecompressed = LZ4_decompress_safe(compressedPtr, outputPtr,
                                            int(compressedSize - 1), int(maxOutputSize));
    if (nDecompressed < 0) {
      if (err) {
        (*err) =
            "Failed to decompress data, possibly corrupt? "
            "LZ4 error code: " +
            std::to_string(nDecompressed) + "\n";
      }
      return 0;
    }
    return size_t(nDecompressed);
  } else {
    // Do each chunk.
    size_t totalDecompressed = 0;
    for (int i = 0; i < nChunks; ++i) {
      int32_t chunkSize = 0;
      if (consumedCompressedSize + sizeof(chunkSize) > compressedSize) {
        if (err) {
           (*err) += "Corrupted chunk data.";
        }
        return 0;
          
      }

      memcpy(&chunkSize, compressedPtr, sizeof(chunkSize));

      if (chunkSize > LZ4_MAX_INPUT_SIZE) {
        if (err) {
           (*err) += "ChunkSize exceeds LZ4_MAX_INPUT_SIZE.\n";
        }
        return 0;
      }
      if (chunkSize <= 0) {
        if (err) {
           (*err) += "Invalid ChunkSize.\n";
        }
        return 0;
      }

      DCOUT("chunk[" << i << "] size = " << chunkSize);

      //std::cout << "chunkSize = " << chunkSize << "\n";
      consumedCompressedSize += sizeof(chunkSize);
      //std::cout << "consumedCompressedSize = " << consumedCompressedSize << "\n";
      //std::cout << "compressedSize = " << compressedSize << "\n";
      if (consumedCompressedSize > compressedSize) {
        if (err) {
           (*err) += "Total chunk size exceeds input compressedSize.\n";
        }
        return 0;
      }

      compressedPtr += sizeof(chunkSize);
      int nDecompressed = LZ4_decompress_safe(
          compressedPtr, outputPtr, chunkSize,
          int(std::min<size_t>(LZ4_MAX_INPUT_SIZE, maxOutputSize)));
      if (nDecompressed <= 0) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt? "
              "LZ4 error code: " +
              std::to_string(nDecompressed) + "\n";
        }
        return 0;
      }
      //std::cout << "nDecompressed = " << nDecompressed << "\n";
      if (nDecompressed > maxOutputSize) {
        if (err) {
          (*err) =
              "Failed to decompress data, possibly corrupt?\n";
        }
        return 0;
      }
      compressedPtr += chunkSize;
      outputPtr += nDecompressed;
      maxOutputSize -= size_t(nDecompressed);
      totalDecompressed += size_t(nDecompressed);
    }
    return totalDecompressed;
  }
  // unreachable.
}